

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* anon_unknown.dwarf_16fe349::wrapOptions
            (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *options,cmListFileBacktrace *bt,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *wrapperFlag,string *wrapperSep,bool concatFlagAndArgs)

{
  reference pvVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long *plVar4;
  reference extraout_RAX;
  reference pvVar5;
  size_type *psVar6;
  char *pcVar7;
  size_type sVar8;
  pointer pbVar9;
  const_iterator i;
  long lVar10;
  pointer __rhs;
  pointer __args;
  undefined8 uVar11;
  pointer pbVar12;
  _Alloc_hider _Var13;
  undefined7 in_register_00000089;
  string *o;
  ulong uVar14;
  ulong uVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string_view separator;
  string_view separator_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  basic_string_view<char,_std::char_traits<char>_> __str_04;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined4 local_94;
  string *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  long local_58;
  string local_50;
  
  local_94 = (undefined4)CONCAT71(in_register_00000089,concatFlagAndArgs);
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar5 = (reference)
           (options->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (reference)
           (options->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar5 != pvVar1) {
    local_90 = wrapperSep;
    local_88 = wrapperFlag;
    if ((wrapperFlag->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (wrapperFlag->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::reserve(__return_storage_ptr__,(long)pvVar1 - (long)pvVar5 >> 5);
      pbVar9 = (options->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pvVar5 = extraout_RAX;
      for (pbVar12 = (options->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar9;
          pbVar12 = pbVar12 + 1) {
        pvVar5 = std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                 emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                           ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                             *)__return_storage_ptr__,pbVar12,bt);
      }
    }
    else {
      local_58 = (ulong)!concatFlagAndArgs * 0x20 + -0x20;
      uVar14 = 0;
      local_80 = options;
      do {
        local_b8._M_string_length = (size_type)(&pvVar5->Value)[uVar14]._M_dataplus._M_p;
        local_b8._M_dataplus._M_p = (pointer)(&pvVar5->Value)[uVar14]._M_string_length;
        __str._M_str = "LINKER:";
        __str._M_len = 7;
        iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_b8,0,7,__str);
        pbVar3 = (options->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar14;
        if (iVar2 == 0) {
LAB_003e8e1c:
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     __return_storage_ptr__,pbVar3,bt);
          uVar15 = uVar14;
        }
        else {
          local_b8._M_string_length = (size_type)(pbVar3->_M_dataplus)._M_p;
          local_b8._M_dataplus._M_p = (pointer)pbVar3->_M_string_length;
          __str_00._M_str = "-Wl,";
          __str_00._M_len = 4;
          iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_b8,0,4,
                             __str_00);
          pbVar12 = (options->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar14;
          if (iVar2 == 0) {
            pcVar7 = (char *)0x4;
          }
          else {
            local_b8._M_string_length = (size_type)(pbVar12->_M_dataplus)._M_p;
            local_b8._M_dataplus._M_p = (pointer)pbVar12->_M_string_length;
            __str_01._M_str = "-Xlinker=";
            __str_01._M_len = 9;
            iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)&local_b8,0,9,
                               __str_01);
            pbVar12 = (options->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar14;
            if (iVar2 != 0) {
              iVar2 = std::__cxx11::string::compare((char *)pbVar12);
              if (iVar2 == 0) {
                uVar15 = uVar14 + 1;
                pbVar12 = (options->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(options->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5)
                    <= uVar15) {
                  pbVar3 = pbVar12 + uVar14;
                  options = local_80;
                  goto LAB_003e8e1c;
                }
                std::operator+(&local_b8,"LINKER:",pbVar12 + uVar15);
                std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                          ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                            *)__return_storage_ptr__,&local_b8,bt);
                options = local_80;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity + 1);
                  options = local_80;
                }
                goto LAB_003e8fca;
              }
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar10 = uVar14 * 0x20;
              while( true ) {
                pbVar12 = (options->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(options->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5)
                    <= uVar14) break;
                local_b8._M_string_length = *(long *)((long)&(pbVar12->_M_dataplus)._M_p + lVar10);
                local_b8._M_dataplus._M_p = *(pointer *)((long)&pbVar12->_M_string_length + lVar10);
                __str_02._M_str = "LINKER:";
                __str_02._M_len = 7;
                iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_b8,0,7
                                   ,__str_02);
                if (iVar2 == 0) {
LAB_003e8cc7:
                  uVar14 = uVar14 - 1;
                  break;
                }
                pbVar12 = (options->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                local_b8._M_string_length = *(long *)((long)&(pbVar12->_M_dataplus)._M_p + lVar10);
                local_b8._M_dataplus._M_p = *(pointer *)((long)&pbVar12->_M_string_length + lVar10);
                __str_03._M_str = "-Wl,";
                __str_03._M_len = 4;
                iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_b8,0,4
                                   ,__str_03);
                if (iVar2 == 0) goto LAB_003e8cc7;
                pbVar12 = (options->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                local_b8._M_string_length = *(long *)((long)&(pbVar12->_M_dataplus)._M_p + lVar10);
                local_b8._M_dataplus._M_p = *(pointer *)((long)&pbVar12->_M_string_length + lVar10);
                __str_04._M_str = "-Xlinker";
                __str_04._M_len = 8;
                iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_b8,0,8
                                   ,__str_04);
                if (iVar2 == 0) goto LAB_003e8cc7;
                uVar14 = uVar14 + 1;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_78,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&(((options->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                           + lVar10));
                lVar10 = lVar10 + 0x20;
              }
              pbVar12 = local_78.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                sVar8 = local_90->_M_string_length;
                if (sVar8 == 0) {
                  pbVar9 = local_78.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  __args = local_78.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  __rhs = local_78.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                  if ((char)local_94 != '\0') {
                    do {
                      std::operator+(&local_b8,
                                     (local_88->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish + -1,__rhs);
                      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_b8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                        operator_delete(local_b8._M_dataplus._M_p,
                                        local_b8.field_2._M_allocated_capacity + 1);
                      }
                      __rhs = __rhs + 1;
                      pbVar9 = local_78.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      __args = local_78.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    } while (__rhs != pbVar12);
                  }
                  for (; __args != pbVar9; __args = __args + 1) {
                    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&(((local_88->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                     _M_p + local_58);
                    for (pbVar12 = (local_88->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar3;
                        pbVar12 = pbVar12 + 1) {
                      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                      ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
                                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                  *)__return_storage_ptr__,pbVar12,bt);
                    }
                    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                    emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                *)__return_storage_ptr__,__args,bt);
                  }
                }
                else {
                  pbVar9 = (local_88->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  pbVar12 = (local_88->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                  if ((char)local_94 == '\0') {
                    if (pbVar9 != pbVar12) {
                      do {
                        std::
                        vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                        emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
                                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                    *)__return_storage_ptr__,pbVar9,bt);
                        pbVar9 = pbVar9 + 1;
                      } while (pbVar9 != pbVar12);
                      sVar8 = local_90->_M_string_length;
                    }
                    separator_00._M_str = (local_90->_M_dataplus)._M_p;
                    separator_00._M_len = sVar8;
                    cmJoin(&local_b8,&local_78,separator_00,(string_view)ZEXT816(0));
                    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                    emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                *)__return_storage_ptr__,&local_b8,bt);
                    uVar11 = local_b8.field_2._M_allocated_capacity;
                    _Var13._M_p = local_b8._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p != &local_b8.field_2) goto LAB_003e8fae;
                  }
                  else {
                    pbVar12 = pbVar12 + -1;
                    if (pbVar9 != pbVar12) {
                      do {
                        std::
                        vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                        emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
                                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                    *)__return_storage_ptr__,pbVar9,bt);
                        pbVar9 = pbVar9 + 1;
                        pbVar12 = (local_88->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish + -1;
                      } while (pbVar9 != pbVar12);
                      sVar8 = local_90->_M_string_length;
                    }
                    separator._M_str = (local_90->_M_dataplus)._M_p;
                    separator._M_len = sVar8;
                    cmJoin(&local_50,&local_78,separator,(string_view)ZEXT816(0));
                    plVar4 = (long *)std::__cxx11::string::replace
                                               ((ulong)&local_50,0,(char *)0x0,
                                                (ulong)(pbVar12->_M_dataplus)._M_p);
                    psVar6 = (size_type *)(plVar4 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar4 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar6) {
                      local_b8.field_2._M_allocated_capacity = *psVar6;
                      local_b8.field_2._8_8_ = plVar4[3];
                      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                    }
                    else {
                      local_b8.field_2._M_allocated_capacity = *psVar6;
                      local_b8._M_dataplus._M_p = (pointer)*plVar4;
                    }
                    local_b8._M_string_length = plVar4[1];
                    *plVar4 = (long)psVar6;
                    plVar4[1] = 0;
                    *(undefined1 *)(plVar4 + 2) = 0;
                    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                    emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                *)__return_storage_ptr__,&local_b8,bt);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                      operator_delete(local_b8._M_dataplus._M_p,
                                      local_b8.field_2._M_allocated_capacity + 1);
                    }
                    uVar11 = local_50.field_2._M_allocated_capacity;
                    _Var13._M_p = local_50._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_003e8fae:
                      operator_delete(_Var13._M_p,uVar11 + 1);
                    }
                  }
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_78);
              uVar15 = uVar14;
              options = local_80;
              goto LAB_003e8fca;
            }
            pcVar7 = (char *)0x9;
          }
          pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::__cxx11::string::replace((ulong)pbVar12,0,pcVar7,0x6db54d);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string&,cmListFileBacktrace_const&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     __return_storage_ptr__,pbVar3,bt);
          uVar15 = uVar14;
        }
LAB_003e8fca:
        uVar14 = uVar15 + 1;
        pvVar5 = (reference)
                 (options->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar14 < (ulong)((long)(options->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >>
                               5));
    }
  }
  return (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)pvVar5;
}

Assistant:

std::vector<BT<std::string>> wrapOptions(
  std::vector<std::string>& options, const cmListFileBacktrace& bt,
  const std::vector<std::string>& wrapperFlag, const std::string& wrapperSep,
  bool concatFlagAndArgs)
{
  std::vector<BT<std::string>> result;

  if (options.empty()) {
    return result;
  }

  if (wrapperFlag.empty()) {
    // nothing specified, insert elements as is
    result.reserve(options.size());
    for (std::string& o : options) {
      result.emplace_back(std::move(o), bt);
    }
    return result;
  }

  for (std::vector<std::string>::size_type index = 0; index < options.size();
       index++) {
    if (cmHasLiteralPrefix(options[index], "LINKER:")) {
      // LINKER wrapper specified, insert elements as is
      result.emplace_back(std::move(options[index]), bt);
      continue;
    }
    if (cmHasLiteralPrefix(options[index], "-Wl,")) {
      // replace option by LINKER wrapper
      result.emplace_back(options[index].replace(0, 4, "LINKER:"), bt);
      continue;
    }
    if (cmHasLiteralPrefix(options[index], "-Xlinker=")) {
      // replace option by LINKER wrapper
      result.emplace_back(options[index].replace(0, 9, "LINKER:"), bt);
      continue;
    }
    if (options[index] == "-Xlinker") {
      // replace option by LINKER wrapper
      if (index + 1 < options.size()) {
        result.emplace_back("LINKER:" + options[++index], bt);
      } else {
        result.emplace_back(std::move(options[index]), bt);
      }
      continue;
    }

    // collect all options which must be transformed
    std::vector<std::string> opts;
    while (index < options.size()) {
      if (!cmHasLiteralPrefix(options[index], "LINKER:") &&
          !cmHasLiteralPrefix(options[index], "-Wl,") &&
          !cmHasLiteralPrefix(options[index], "-Xlinker")) {
        opts.emplace_back(std::move(options[index++]));
      } else {
        --index;
        break;
      }
    }
    if (opts.empty()) {
      continue;
    }

    if (!wrapperSep.empty()) {
      if (concatFlagAndArgs) {
        // insert flag elements except last one
        for (auto i = wrapperFlag.begin(); i != wrapperFlag.end() - 1; ++i) {
          result.emplace_back(*i, bt);
        }
        // concatenate last flag element and all list values
        // in one option
        result.emplace_back(wrapperFlag.back() + cmJoin(opts, wrapperSep), bt);
      } else {
        for (std::string const& i : wrapperFlag) {
          result.emplace_back(i, bt);
        }
        // concatenate all list values in one option
        result.emplace_back(cmJoin(opts, wrapperSep), bt);
      }
    } else {
      // prefix each element of list with wrapper
      if (concatFlagAndArgs) {
        std::transform(opts.begin(), opts.end(), opts.begin(),
                       [&wrapperFlag](std::string const& o) -> std::string {
                         return wrapperFlag.back() + o;
                       });
      }
      for (std::string& o : opts) {
        for (auto i = wrapperFlag.begin(),
                  e = concatFlagAndArgs ? wrapperFlag.end() - 1
                                        : wrapperFlag.end();
             i != e; ++i) {
          result.emplace_back(*i, bt);
        }
        result.emplace_back(std::move(o), bt);
      }
    }
  }
  return result;
}